

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O1

void suprsrv(supcxdef *sup,_func_void_bifcxdef_ptr_int **bif,toktdef *tab,int max,int v1compat,
            char *new_do,int casefold)

{
  int iVar1;
  _func_void_bifcxdef_ptr_int *p_Var2;
  _func_void_toktdef_ptr_char_ptr_int_int_int_int *p_Var3;
  bool bVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  supbidef *psVar9;
  supkwdef *psVar10;
  supprdef *psVar11;
  ulong uVar12;
  char *__src;
  char buf [40];
  char local_58 [40];
  
  if (supbitab[0].supbinam != (char *)0x0) {
    uVar12 = 0;
    uVar8 = (ulong)(uint)max;
    if (max < 1) {
      uVar8 = uVar12;
    }
    psVar9 = supbitab;
    pcVar7 = supbitab[0].supbinam;
    do {
      psVar9 = psVar9 + 1;
      if (uVar8 == uVar12) {
        errsigf(sup->supcxerr,"TADS",0x1f9);
      }
      p_Var2 = psVar9[-1].supbifn;
      supaddsym(tab,pcVar7,6,(int)uVar12,casefold);
      bif[uVar12] = p_Var2;
      uVar12 = uVar12 + 1;
      pcVar7 = psVar9->supbinam;
    } while (pcVar7 != (char *)0x0);
  }
  bVar4 = false;
  pcVar7 = "not";
  psVar10 = supkwtab;
  do {
    psVar10 = psVar10 + 1;
    if (*pcVar7 == '\x02') {
      if (v1compat != 0) break;
    }
    else {
      __src = pcVar7;
      if (bVar4) {
        __src = new_do;
      }
      if (new_do == (char *)0x0) {
        __src = pcVar7;
      }
      bVar4 = true;
      if (*pcVar7 != '\x01') {
        pcVar7 = __src;
        if (casefold != 0) {
          pcVar7 = local_58;
          strcpy(pcVar7,__src);
          os_strlwr(pcVar7);
        }
        p_Var3 = tab->toktfadd;
        sVar6 = strlen(pcVar7);
        iVar1 = psVar10[-1].supkwtok;
        uVar5 = tokhsh(pcVar7);
        (*p_Var3)(tab,pcVar7,(int)sVar6,0xb,iVar1,uVar5);
        bVar4 = false;
      }
    }
    pcVar7 = psVar10->supkwnam;
  } while (pcVar7 != (char *)0x0);
  supaddsym(tab,"self",5,0,casefold);
  supaddsym(tab,"inherited",9,0,casefold);
  supaddsym(tab,"argcount",0xd,0,casefold);
  pcVar7 = "verb";
  psVar11 = supprtab;
  do {
    psVar11 = psVar11 + 1;
    supaddsym(tab,pcVar7,3,(uint)psVar11[-1].supprval,casefold);
    pcVar7 = psVar11->supprnam;
  } while (pcVar7 != (char *)0x0);
  return;
}

Assistant:

void suprsrv(supcxdef *sup, void (*bif[])(bifcxdef *, int),
             toktdef *tab, int max, int v1compat, char *new_do,
             int casefold)
{
    supkwdef *kw;
    supbidef *p;
    int       i;
    supprdef *pr;
    extern    supbidef osfar_t supbitab[];
    int       do_kw = FALSE;
    char     *kwname;
    char      buf[40];

    /* add built-in functions */
    for (p = supbitab, i = 0 ; p->supbinam ; ++i, ++p)
    {
        if (i >= max) errsig(sup->supcxerr, ERR_MANYBIF);
        supaddbi(bif, tab, p->supbinam, p->supbifn, i, casefold);
    }

    /* add keywords */
    for (kw = supkwtab ; kw->supkwnam ; ++kw)
    {
        if (kw->supkwnam[0] == '\002')
        {
            if (v1compat) break;               /* no v2 keywords - quit now */
            else continue;          /* keep going, but skip this flag entry */
        }
        
        /* if this is the "do" keyword, change to user-supplied value */
        if (do_kw && new_do)
            kwname = new_do;
        else
            kwname = kw->supkwnam;
        
        if (kw->supkwnam[0] == '\001')
        {
            do_kw = TRUE;
            continue;
        }
        else
            do_kw = FALSE;

        if (casefold)
        {
            strcpy(buf, kwname);
            os_strlwr(buf);
            kwname = buf;
        }
        (*tab->toktfadd)(tab, kwname, (int)strlen(kwname),
                         TOKSTKW, kw->supkwtok, tokhsh(kwname));
    }

    /* add pseudo-variables */
    supaddsym(tab, "self", TOKSTSELF, 0, casefold);
    supaddsym(tab, "inherited", TOKSTINHERIT, 0, casefold);
    supaddsym(tab, "argcount", TOKSTARGC, 0, casefold);
    
    /* add built-in properties */
    for (pr = supprtab ; pr->supprnam ; ++pr)
        supaddsym(tab, pr->supprnam, TOKSTPROP, pr->supprval, casefold);
}